

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handle.cpp
# Opt level: O0

string * __thiscall
remote::Handle::GetPidString_abi_cxx11_(string *__return_storage_ptr__,Handle *this)

{
  ostream *this_00;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  Handle *local_18;
  Handle *this_local;
  
  local_18 = this;
  this_local = (Handle *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  this_00 = (ostream *)std::ostream::operator<<(local_190,std::dec);
  std::ostream::operator<<(this_00,this->pid);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string Handle::GetPidString() {
    stringstream ss;
    ss << dec << pid;
    return ss.str();
}